

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form3_Histogram(HistogramForm3 Histogram)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  uint uVar8;
  ushort uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  Image input;
  uint32_t local_80;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t local_74;
  undefined1 local_70 [40];
  Image local_48;
  
  bVar6 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)local_70,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_48,bVar6,0,0,(ImageTemplate<unsigned_char> *)local_70);
  local_70._0_8_ = &PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_70);
  Unit_Test::generateRoi(&local_48,&local_74,&local_78,&local_7c,&local_80);
  (*Histogram)((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,&local_48,local_74,
               local_78,local_7c,local_80);
  if (local_70._8_8_ - local_70._0_8_ == 0x400) {
    uVar8 = 0;
    if (*(uint *)(local_70._0_8_ + (ulong)bVar6 * 4) == local_80 * local_7c) {
      if (local_70._0_8_ != local_70._8_8_) {
        auVar11 = vpbroadcastq_avx512f();
        auVar11 = vpsrlq_avx512f(auVar11,2);
        auVar16 = ZEXT1664((undefined1  [16])0x0);
        lVar7 = 0;
        auVar12 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar14 = vmovdqa64_avx512f(auVar16);
          auVar16 = vpbroadcastq_avx512f();
          auVar15 = vporq_avx512f(auVar16,auVar12);
          auVar16 = vporq_avx512f(auVar16,auVar13);
          uVar4 = vpcmpuq_avx512f(auVar16,auVar11,2);
          bVar6 = (byte)uVar4;
          uVar4 = vpcmpuq_avx512f(auVar15,auVar11,2);
          bVar5 = (byte)uVar4;
          uVar9 = CONCAT11(bVar5,bVar6);
          auVar16 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_70._0_8_ + lVar7 * 4));
          auVar15._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar16._4_4_;
          auVar15._0_4_ = (uint)(bVar6 & 1) * auVar16._0_4_;
          auVar15._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar16._8_4_;
          auVar15._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar16._12_4_;
          auVar15._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar16._16_4_;
          auVar15._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar16._20_4_;
          auVar15._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar16._24_4_;
          auVar15._28_4_ = (uint)((byte)(uVar9 >> 7) & 1) * auVar16._28_4_;
          auVar15._32_4_ = (uint)(bVar5 & 1) * auVar16._32_4_;
          auVar15._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar16._36_4_;
          auVar15._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar16._40_4_;
          auVar15._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar16._44_4_;
          auVar15._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar16._48_4_;
          auVar15._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar16._52_4_;
          auVar15._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar16._56_4_;
          auVar15._60_4_ = (uint)(bVar5 >> 7) * auVar16._60_4_;
          auVar16 = vpaddd_avx512f(auVar15,auVar14);
          lVar7 = lVar7 + 0x10;
        } while (lVar7 != 0x100);
        auVar11 = vmovdqa32_avx512f(auVar16);
        auVar12._0_4_ = (uint)(bVar6 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar14._0_4_
        ;
        bVar1 = (bool)((byte)(uVar9 >> 1) & 1);
        auVar12._4_4_ = (uint)bVar1 * auVar11._4_4_ | (uint)!bVar1 * auVar14._4_4_;
        bVar1 = (bool)((byte)(uVar9 >> 2) & 1);
        auVar12._8_4_ = (uint)bVar1 * auVar11._8_4_ | (uint)!bVar1 * auVar14._8_4_;
        bVar1 = (bool)((byte)(uVar9 >> 3) & 1);
        auVar12._12_4_ = (uint)bVar1 * auVar11._12_4_ | (uint)!bVar1 * auVar14._12_4_;
        bVar1 = (bool)((byte)(uVar9 >> 4) & 1);
        auVar12._16_4_ = (uint)bVar1 * auVar11._16_4_ | (uint)!bVar1 * auVar14._16_4_;
        bVar1 = (bool)((byte)(uVar9 >> 5) & 1);
        auVar12._20_4_ = (uint)bVar1 * auVar11._20_4_ | (uint)!bVar1 * auVar14._20_4_;
        bVar1 = (bool)((byte)(uVar9 >> 6) & 1);
        auVar12._24_4_ = (uint)bVar1 * auVar11._24_4_ | (uint)!bVar1 * auVar14._24_4_;
        bVar1 = (bool)((byte)(uVar9 >> 7) & 1);
        auVar12._28_4_ = (uint)bVar1 * auVar11._28_4_ | (uint)!bVar1 * auVar14._28_4_;
        auVar12._32_4_ =
             (uint)(bVar5 & 1) * auVar11._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar14._32_4_;
        bVar1 = (bool)(bVar5 >> 1 & 1);
        auVar12._36_4_ = (uint)bVar1 * auVar11._36_4_ | (uint)!bVar1 * auVar14._36_4_;
        bVar1 = (bool)(bVar5 >> 2 & 1);
        auVar12._40_4_ = (uint)bVar1 * auVar11._40_4_ | (uint)!bVar1 * auVar14._40_4_;
        bVar1 = (bool)(bVar5 >> 3 & 1);
        auVar12._44_4_ = (uint)bVar1 * auVar11._44_4_ | (uint)!bVar1 * auVar14._44_4_;
        bVar1 = (bool)(bVar5 >> 4 & 1);
        auVar12._48_4_ = (uint)bVar1 * auVar11._48_4_ | (uint)!bVar1 * auVar14._48_4_;
        bVar1 = (bool)(bVar5 >> 5 & 1);
        auVar12._52_4_ = (uint)bVar1 * auVar11._52_4_ | (uint)!bVar1 * auVar14._52_4_;
        bVar1 = (bool)(bVar5 >> 6 & 1);
        auVar12._56_4_ = (uint)bVar1 * auVar11._56_4_ | (uint)!bVar1 * auVar14._56_4_;
        auVar12._60_4_ =
             (uint)(bVar5 >> 7) * auVar11._60_4_ | (uint)!(bool)(bVar5 >> 7) * auVar14._60_4_;
        auVar10 = vextracti64x4_avx512f(auVar12,1);
        auVar11 = vpaddd_avx512f(auVar12,ZEXT3264(auVar10));
        auVar2 = vpaddd_avx(auVar11._0_16_,auVar11._16_16_);
        auVar3 = vpshufd_avx(auVar2,0xee);
        auVar2 = vpaddd_avx(auVar2,auVar3);
        auVar3 = vpshufd_avx(auVar2,0x55);
        auVar2 = vpaddd_avx(auVar2,auVar3);
        uVar8 = auVar2._0_4_;
      }
      uVar8 = (uint)(uVar8 == local_80 * local_7c);
    }
  }
  else {
    uVar8 = 0;
  }
  if ((_func_int **)local_70._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_70._0_8_);
  }
  local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
  return SUB41(uVar8,0);
}

Assistant:

bool form3_Histogram(HistogramForm3 Histogram)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const std::vector < uint32_t > histogram = Histogram( input, roiX, roiY, roiWidth, roiHeight );

        return histogram.size() == 256u && histogram[intensity] == roiWidth * roiHeight &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == roiWidth * roiHeight;
    }